

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::Value(Value *this,char *beginValue,char *endValue)

{
  char *pcVar1;
  
  *(ushort *)&this->field_0x8 = (ushort)*(undefined4 *)&this->field_0x8 & 0xfe00 | 0x104;
  this->comments_ = (CommentInfo *)0x0;
  pcVar1 = duplicateStringValue(beginValue,(int)endValue - (int)beginValue);
  (this->value_).string_ = pcVar1;
  return;
}

Assistant:

Value::Value( const char *beginValue, 
              const char *endValue )
   : type_( stringValue )
   , allocated_( true )
# ifdef JSON_VALUE_USE_INTERNAL_MAP
   , itemIsUsed_( 0 )
#endif
   , comments_( 0 )
{
   value_.string_ = duplicateStringValue( beginValue, 
                                          (unsigned int)(endValue - beginValue) );
}